

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O3

MemoryStream * __thiscall Assimp::Ogre::VertexData::VertexBuffer(VertexData *this,uint16_t source)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  bool bVar5;
  key_type_conflict local_2;
  
  p_Var3 = (this->vertexBindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var1 = &(this->vertexBindings)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var1->_M_header;
    do {
      bVar5 = (ushort)(short)p_Var3[1]._M_color < source;
      if (!bVar5) {
        p_Var4 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[bVar5];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var4 != p_Var1) && ((ushort)(short)p_Var4[1]._M_color <= source)) {
      pmVar2 = std::
               map<unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>_>_>_>
               ::operator[](&this->vertexBindings,&local_2);
      return (pmVar2->super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
    }
  }
  return (MemoryStream *)0x0;
}

Assistant:

MemoryStream *VertexData::VertexBuffer(uint16_t source)
{
    if (vertexBindings.find(source) != vertexBindings.end())
        return vertexBindings[source].get();
    return 0;
}